

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O1

void __thiscall indigox::ElectronOpt::ElectronOpt(ElectronOpt *this)

{
  undefined1 local_1a;
  undefined1 local_19;
  
  this->electronsToAdd_ = 0;
  (this->possibleLocations_).
  super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->possibleLocations_).
  super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->possibleLocations_).
  super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->molGraph_).super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<indigox::MolecularGraph,std::allocator<indigox::MolecularGraph>>
            (&(this->molGraph_).
              super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MolecularGraph **)&this->molGraph_,(allocator<indigox::MolecularGraph> *)&local_1a);
  (this->elnGraph_).super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<indigox::ElectronGraph,std::allocator<indigox::ElectronGraph>>
            (&(this->elnGraph_).
              super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (ElectronGraph **)&this->elnGraph_,(allocator<indigox::ElectronGraph> *)&local_19);
  (this->scores_)._M_h._M_buckets = &(this->scores_)._M_h._M_single_bucket;
  (this->scores_)._M_h._M_bucket_count = 1;
  (this->scores_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->scores_)._M_h._M_element_count = 0;
  (this->scores_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scores_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->scores_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->algo_).
  super___shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->algo_).
  super___shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

ElectronOpt::ElectronOpt()
: electronsToAdd_(0), molGraph_(std::make_shared<MolecularGraph>()),
elnGraph_(std::make_shared<ElectronGraph>()) { }